

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# room.cc
# Opt level: O1

int GetObjectTileMask(uint8_t object)

{
  int iVar1;
  
  iVar1 = 0;
  if ((byte)(object + 0x9b) < 0x13) {
    iVar1 = (&DAT_00108230)[(byte)(object + 0x9b)];
  }
  return iVar1;
}

Assistant:

int GetObjectTileMask(uint8_t object) {
  switch (object) {
    case 'e':  // Treasure chest
      return 64;
    case 'f':  // Smoke
      return 66;
    case 'n':  // Old body
      return 69;
    case 'o':  // Old bones
      return 70;
    case 'p':  // Old stone coffin
      return 71;
    case 'q':  // Old grave
      return 65;
    case 's':  // Old skeleton
      return 72;
    case 't':  // Old skeleton
      return 73;
    case 'v':  // Just some blood
      return 83;
    case 'w':  // Stone marker
      return 81;
  }

  return 0;
}